

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BroadCastServer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ostream *poVar12;
  allocator<char> local_d9;
  __shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2> local_c8;
  PTR listenThrean;
  shared_ptr<brynet::net::EventLoop> mainLoop;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  __shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2> local_78 [2];
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (argc == 2) {
    iVar9 = atoi(argv[1]);
    brynet::net::base::InitSocket();
    std::make_shared<brynet::net::WrapTcpService>();
    std::__shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&service.super___shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>,
               local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78[0]._M_refcount);
    std::make_shared<brynet::net::EventLoop>();
    brynet::net::ListenThread::Create();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"0.0.0.0",&local_d9);
    std::__shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d8,
               &mainLoop.super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c8,
               &listenThrean.
                super___shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>);
    local_88 = (code *)0x0;
    pcStack_80 = (code *)0x0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_98._M_unused._M_object = operator_new(0x20);
    uVar1 = local_d8._M_ptr._0_4_;
    uVar2 = local_d8._M_ptr._4_4_;
    uVar3 = local_d8._M_refcount._M_pi._0_4_;
    uVar4 = local_d8._M_refcount._M_pi._4_4_;
    local_d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d8._M_ptr = (element_type *)0x0;
    uVar5 = local_c8._M_ptr._0_4_;
    uVar6 = local_c8._M_ptr._4_4_;
    uVar7 = local_c8._M_refcount._M_pi._0_4_;
    uVar8 = local_c8._M_refcount._M_pi._4_4_;
    local_c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c8._M_ptr = (element_type *)0x0;
    *(undefined4 *)local_98._M_unused._0_8_ = uVar1;
    *(undefined4 *)((long)local_98._M_unused._0_8_ + 4) = uVar2;
    *(undefined4 *)((long)local_98._M_unused._0_8_ + 8) = uVar3;
    *(undefined4 *)((long)local_98._M_unused._0_8_ + 0xc) = uVar4;
    *(undefined4 *)((long)local_98._M_unused._0_8_ + 0x10) = uVar5;
    *(undefined4 *)((long)local_98._M_unused._0_8_ + 0x14) = uVar6;
    *(undefined4 *)((long)local_98._M_unused._0_8_ + 0x18) = uVar7;
    *(undefined4 *)((long)local_98._M_unused._0_8_ + 0x1c) = uVar8;
    pcStack_80 = std::
                 _Function_handler<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/examples/BroadCastServer.cpp:83:55)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/examples/BroadCastServer.cpp:83:55)>
               ::_M_manager;
    brynet::net::ListenThread::startListen
              (listenThrean.
               super___shared_ptr<brynet::net::ListenThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,
               local_78,iVar9);
    std::_Function_base::~_Function_base((_Function_base *)&local_98);
    main::$_0::~__0((__0 *)&local_d8);
    std::__cxx11::string::~string((string *)local_78);
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_48 = 0;
    uStack_40 = 0;
    brynet::net::WrapTcpService::startWorkThread
              (service.super___shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,2);
    std::_Function_base::~_Function_base((_Function_base *)&local_58);
    do {
      lVar10 = std::chrono::_V2::steady_clock::now();
      do {
        brynet::net::EventLoop::loop
                  ((long)mainLoop.
                         super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
        lVar11 = std::chrono::_V2::steady_clock::now();
      } while (lVar11 - lVar10 < 1000000000);
      poVar12 = std::operator<<((ostream *)&std::cout,"cost ");
      poVar12 = std::ostream::_M_insert<long>((long)poVar12);
      poVar12 = std::operator<<(poVar12," ms, clientnum:");
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      poVar12 = std::operator<<(poVar12,", recv");
      poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
      poVar12 = std::operator<<(poVar12," K/s, ");
      poVar12 = std::operator<<(poVar12,"num : ");
      poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
      poVar12 = std::operator<<(poVar12,", send ");
      poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
      poVar12 = std::operator<<(poVar12," M/s, ");
      poVar12 = std::operator<<(poVar12," num: ");
      poVar12 = std::ostream::_M_insert<long_long>((longlong)poVar12);
      std::endl<char,std::char_traits<char>>(poVar12);
      LOCK();
      TotalRecvLen.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
      LOCK();
      TotalSendLen.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
      LOCK();
      RecvPacketNum.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
      LOCK();
      SendPacketNum.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
    } while( true );
  }
  fwrite("Usage : <listen port> \n",0x17,1,_stderr);
  exit(-1);
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage : <listen port> \n");
        exit(-1);
    }

    int port = atoi(argv[1]);
    brynet::net::base::InitSocket();

    service = std::make_shared<WrapTcpService>();
    auto mainLoop = std::make_shared<EventLoop>();
    auto listenThrean = ListenThread::Create();

    listenThrean->startListen(false, "0.0.0.0", port, [mainLoop, listenThrean](TcpSocket::PTR socket) {
        socket->SocketNodelay();
        socket->SetSendSize(32 * 1024);
        socket->SetRecvSize(32 * 1024);

        auto enterCallback = [mainLoop](const TCPSession::PTR& session) {
            mainLoop->pushAsyncProc([session]() {
                addClientID(session);
            });

            session->setDisConnectCallback([mainLoop](const TCPSession::PTR& session) {
                mainLoop->pushAsyncProc([session]() {
                    removeClientID(session);
                });
            });

            session->setDataCallback([mainLoop](const TCPSession::PTR& session, const char* buffer, size_t len) {
                const char* parseStr = buffer;
                size_t totalProcLen = 0;
                size_t leftLen = len;

                while (true)
                {
                    bool flag = false;
                    auto HEAD_LEN = sizeof(uint32_t) + sizeof(uint16_t);
                    if (leftLen >= HEAD_LEN)
                    {
                        BasePacketReader rp(parseStr, leftLen);
                        auto packet_len = rp.readUINT32();
                        if (leftLen >= packet_len && packet_len >= HEAD_LEN)
                        {
                            auto packet = DataSocket::makePacket(parseStr, packet_len);
                            mainLoop->pushAsyncProc([packet]() {
                                broadCastPacket(packet);
                            });

                            totalProcLen += packet_len;
                            parseStr += packet_len;
                            leftLen -= packet_len;
                            flag = true;
                        }
                        rp.skipAll();
                    }

                    if (!flag)
                    {
                        break;
                    }
                }

                return totalProcLen;
            });
        };
        service->addSession(std::move(socket),
            AddSessionOption::WithEnterCallback(enterCallback),
            AddSessionOption::WithMaxRecvBufferSize(1024 * 1024));
    });

    service->startWorkThread(2);

    auto now = std::chrono::steady_clock::now();
    while (true)
    {
        mainLoop->loop(10);
        auto diff = std::chrono::steady_clock::now() - now;
        if (diff >= std::chrono::seconds(1))
        {
            auto msDiff = std::chrono::duration_cast<std::chrono::milliseconds>(diff).count();
            std::cout << "cost " << 
                msDiff << " ms, clientnum:" << 
                getClientNum() << ", recv" <<
                (TotalRecvLen / 1024) * 1000 / msDiff  << 
                " K/s, " << "num : " << 
                RecvPacketNum * 1000 / msDiff << ", send " <<
                (TotalSendLen / 1024) / 1024 * 1000 / msDiff <<
                " M/s, " << " num: " << 
                SendPacketNum * 1000 / msDiff << std::endl;
            TotalRecvLen = 0;
            TotalSendLen = 0;
            RecvPacketNum = 0;
            SendPacketNum = 0;
            now = std::chrono::steady_clock::now();
        }
    }

    service->stopWorkThread();

    return 0;
}